

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLLibraryArticulatedSystemsLoader.cpp
# Opt level: O3

bool __thiscall
COLLADASaxFWL::LibraryArticulatedSystemsLoader::begin__axis_info____kinematics_axis_info_type
          (LibraryArticulatedSystemsLoader *this,
          axis_info____kinematics_axis_info_type__AttributeData *attributeData)

{
  KinematicsController *pKVar1;
  allocator<char> local_151;
  String local_150;
  SidAddress local_130;
  AxisInfo local_b0;
  
  if (attributeData->axis != (char *)0x0) {
    pKVar1 = this->mCurrentKinematicsController;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,attributeData->axis,&local_151);
    SidAddress::SidAddress(&local_130,&local_150);
    AxisInfo::AxisInfo(&local_b0,&local_130);
    std::vector<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>::
    emplace_back<COLLADASaxFWL::AxisInfo>(&pKVar1->mAxisInfos,&local_b0);
    local_b0._vptr_AxisInfo = (_func_int **)&PTR__AxisInfo_009a77a0;
    SidAddress::~SidAddress(&local_b0.mJointPrimitiveAddress);
    SidAddress::~SidAddress(&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
    }
    this->mCurrentAxisInfo =
         (this->mCurrentKinematicsController->mAxisInfos).
         super__Vector_base<COLLADASaxFWL::AxisInfo,_std::allocator<COLLADASaxFWL::AxisInfo>_>.
         _M_impl.super__Vector_impl_data._M_finish + -1;
    IFilePartLoader::addToSidTree((IFilePartLoader *)this,(char *)0x0,attributeData->sid);
  }
  return true;
}

Assistant:

bool LibraryArticulatedSystemsLoader::begin__axis_info____kinematics_axis_info_type( const axis_info____kinematics_axis_info_type__AttributeData& attributeData )
	{
		if ( attributeData.axis )
		{
			mCurrentKinematicsController->getAxisInfos().push_back(AxisInfo(SidAddress(String(attributeData.axis))));
			mCurrentAxisInfo = &mCurrentKinematicsController->getAxisInfos().back();
			addToSidTree( 0, attributeData.sid );
		}
		return true;
	}